

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

Matrix<float,_4,_4> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,4,4>
          (Matrix<float,_4,_4> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_4> *a,
          Vector<float,_4> *b)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  Matrix<float,_4,_4> *extraout_RDX;
  Matrix<float,_4,_4> *mat;
  Matrix<float,_4,_4> *extraout_RDX_00;
  int local_68;
  int local_64;
  int c;
  int r;
  Matrix<float,_4,_4> retVal;
  Vector<float,_4> *b_local;
  Vector<float,_4> *a_local;
  
  retVal.m_data.m_data[3].m_data._8_8_ = a;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&c);
  mat = extraout_RDX;
  for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
      pfVar3 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_68);
      fVar1 = *pfVar3;
      pfVar3 = tcu::Vector<float,_4>::operator[]
                         ((Vector<float,_4> *)retVal.m_data.m_data[3].m_data._8_8_,local_64);
      fVar2 = *pfVar3;
      pfVar3 = tcu::Matrix<float,_4,_4>::operator()((Matrix<float,_4,_4> *)&c,local_64,local_68);
      *pfVar3 = fVar1 * fVar2;
      mat = extraout_RDX_00;
    }
  }
  tcu::transpose<float,4,4>(__return_storage_ptr__,(tcu *)&c,mat);
  tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)&c);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}